

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

cmArgumentParser<Arguments> * __thiscall
cmArgumentParser<cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
::Bind<std::__cxx11::string>
          (cmArgumentParser<cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
           *this,static_string_view name,
          offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          member)

{
  string_view name_00;
  anon_class_8_1_60e67bd8 local_60;
  KeywordAction local_58;
  cmArgumentParser<Arguments> *local_38;
  char *pcStack_30;
  offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  member_local;
  cmArgumentParser<Arguments> *this_local;
  static_string_view name_local;
  
  pcStack_30 = name.super_string_view._M_str;
  local_38 = (cmArgumentParser<Arguments> *)name.super_string_view._M_len;
  local_60.member = member;
  local_28 = member;
  member_local = (offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  )this;
  this_local = local_38;
  name_local.super_string_view._M_len = (size_t)pcStack_30;
  std::function<void(ArgumentParser::Instance&)>::
  function<cmArgumentParser<cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>::Bind<std::__cxx11::string>(cm::static_string_view,std::__cxx11::string_cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments::*)::_lambda(ArgumentParser::Instance&)_1_,void>
            ((function<void(ArgumentParser::Instance&)> *)&local_58,&local_60);
  name_00._M_str = pcStack_30;
  name_00._M_len = (size_t)local_38;
  ArgumentParser::Base::Bind((Base *)this,name_00,&local_58);
  std::function<void_(ArgumentParser::Instance_&)>::~function(&local_58);
  return (cmArgumentParser<Arguments> *)this;
}

Assistant:

cmArgumentParser& Bind(cm::static_string_view name, T Result::*member)
  {
    this->Base::Bind(name, [member](Instance& instance) {
      instance.Bind(static_cast<Result*>(instance.Result)->*member);
    });
    return *this;
  }